

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_output_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float out03;
  float out02;
  float out01;
  float out00;
  float tmp13b_1;
  float tmp02b_1;
  float tmp13a_1;
  float tmp02a_1;
  float tmp05;
  float tmp04;
  float tmp03;
  float tmp02;
  float tmp01;
  float tmp00;
  int m_3;
  float tmp3m;
  float tmp2m;
  float tmp1m;
  float tmp0m;
  float tmp13b;
  float tmp02b;
  float tmp13a;
  float tmp02a;
  float out0tm5;
  float out0tm4;
  float out0tm3;
  float out0tm2;
  float out0tm1;
  float out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [4] [6];
  float bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  float local_3d4;
  int local_368;
  int local_32c;
  float *local_328;
  float *local_320;
  float *local_318;
  float *local_310;
  float *local_308;
  float *local_300;
  float *local_2f8;
  int local_2f0;
  int local_2ec;
  float local_2e8 [6];
  float afStack_2d0 [6];
  float afStack_2b8 [6];
  float afStack_2a0 [6];
  float local_288;
  long local_278 [3];
  undefined4 local_260;
  long local_258;
  int local_250;
  int local_24c;
  int local_248;
  undefined4 local_244;
  undefined4 local_240;
  long local_238;
  long local_230 [3];
  undefined4 local_218;
  long local_210;
  int local_208;
  int local_204;
  int local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  long local_1f0;
  int local_1e4;
  long local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  long *local_1a0;
  long *local_190;
  long *local_168;
  long *local_148;
  undefined1 local_13d;
  int local_13c;
  long *local_130;
  long *local_110;
  undefined1 local_fd;
  int local_fc;
  long *local_f0;
  int local_9c;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  long *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  long *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1c4 = *(int *)((long)in_RSI + 0x2c);
  local_1c8 = (int)in_RSI[6];
  lVar6 = in_RSI[7];
  local_1cc = (int)lVar6;
  local_1d0 = local_1c4 / 4;
  local_1d4 = (int)in_RSI[6] / 4;
  local_1d8 = local_1d0 * local_1d4;
  local_1e0 = *in_RDX;
  for (local_1e4 = 0; local_1e4 < (int)lVar6; local_1e4 = local_1e4 + 1) {
    local_f0 = local_230;
    local_fc = local_1e4;
    local_64 = *(int *)((long)in_RDI + 0x2c);
    local_68 = (int)in_RDI[6];
    local_78 = *in_RDI + in_RDI[8] * (long)local_1e4 * in_RDI[2];
    local_80 = in_RDI[2];
    local_60 = local_230;
    local_6c = *(undefined4 *)((long)in_RDI + 0x34);
    local_84 = (int)in_RDI[3];
    local_90 = in_RDI[4];
    local_230[0] = local_78;
    local_230[1] = 0;
    local_230[2] = local_80;
    local_218 = (int)in_RDI[3];
    local_210 = in_RDI[4];
    local_204 = local_64;
    local_200 = local_68;
    local_1fc = 1;
    local_1f8 = *(undefined4 *)((long)in_RDI + 0x34);
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_c = 0x10;
    local_208 = (int)in_RDI[5] + -1;
    if ((int)in_RDI[5] == 4) {
      local_1f0 = (long)*(int *)((long)in_RDI + 0x2c) * (long)(int)in_RDI[6];
    }
    local_fd = 1;
    local_130 = local_278;
    local_13c = local_1e4;
    local_2c = *(int *)((long)in_RSI + 0x2c);
    local_30 = (int)in_RSI[6];
    local_40 = *in_RSI + in_RSI[8] * (long)local_1e4 * in_RSI[2];
    local_48 = in_RSI[2];
    local_28 = local_278;
    local_34 = *(undefined4 *)((long)in_RSI + 0x34);
    local_4c = (int)in_RSI[3];
    local_58 = in_RSI[4];
    local_278[0] = local_40;
    local_278[1] = 0;
    local_278[2] = local_48;
    local_260 = (int)in_RSI[3];
    local_258 = in_RSI[4];
    local_24c = local_2c;
    local_248 = local_30;
    local_244 = 1;
    local_240 = *(undefined4 *)((long)in_RSI + 0x34);
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_1c = 0x10;
    local_250 = (int)in_RSI[5] + -1;
    if ((int)in_RSI[5] == 4) {
      local_238 = (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6];
    }
    local_13d = 1;
    if (local_1e0 == 0) {
      local_3d4 = 0.0;
    }
    else {
      local_3d4 = *(float *)(local_1e0 + (long)local_1e4 * 4);
    }
    local_288 = local_3d4;
    for (local_2ec = 0; local_2ec < local_1d4; local_2ec = local_2ec + 1) {
      for (local_2f0 = 0; local_2f0 < local_1d0; local_2f0 = local_2f0 + 1) {
        local_110 = local_230;
        local_2f8 = (float *)(local_78 + (long)(local_2ec * local_1d0 + local_2f0) * 4);
        local_300 = local_2f8 + local_1d8;
        local_308 = local_2f8 + local_1d8 * 2;
        local_310 = local_2f8 + local_1d8 * 3;
        local_318 = local_2f8 + local_1d8 * 4;
        local_320 = local_2f8 + local_1d8 * 5;
        local_98 = local_278;
        local_9c = local_2ec << 2;
        local_328 = (float *)(local_40 + (long)local_2c * (long)(local_2ec << 2) * local_48 +
                             (long)(local_2f0 << 2) * 4);
        for (local_32c = 0; local_32c < 6; local_32c = local_32c + 1) {
          fVar1 = *local_320;
          fVar2 = *local_300 + *local_308;
          fVar4 = *local_300 - *local_308;
          fVar3 = *local_310 + *local_318;
          fVar5 = *local_310 - *local_318;
          local_2e8[local_32c] = *local_2f8 + fVar2 + fVar3;
          local_2e8[(long)local_32c + 6] = fVar4 + fVar5 * 2.0;
          afStack_2b8[local_32c] = fVar2 + fVar3 * 4.0;
          afStack_2a0[local_32c] = fVar1 + fVar4 + fVar5 * 8.0;
          local_2f8 = local_2f8 + local_1d8 * 6;
          local_300 = local_300 + local_1d8 * 6;
          local_308 = local_308 + local_1d8 * 6;
          local_310 = local_310 + local_1d8 * 6;
          local_318 = local_318 + local_1d8 * 6;
          local_320 = local_320 + local_1d8 * 6;
        }
        for (local_368 = 0; local_368 < 4; local_368 = local_368 + 1) {
          fVar1 = local_2e8[(long)local_368 * 6 + 5];
          fVar2 = local_2e8[(long)local_368 * 6 + 1] + local_2e8[(long)local_368 * 6 + 2];
          fVar4 = local_2e8[(long)local_368 * 6 + 1] - local_2e8[(long)local_368 * 6 + 2];
          fVar3 = local_2e8[(long)local_368 * 6 + 3] + local_2e8[(long)local_368 * 6 + 4];
          fVar5 = local_2e8[(long)local_368 * 6 + 3] - local_2e8[(long)local_368 * 6 + 4];
          *local_328 = local_3d4 + local_2e8[(long)local_368 * 6] + fVar2 + fVar3;
          local_328[1] = local_3d4 + fVar4 + fVar5 * 2.0;
          local_328[2] = local_3d4 + fVar2 + fVar3 * 4.0;
          local_328[3] = local_3d4 + fVar1 + fVar4 + fVar5 * 8.0;
          local_328 = local_328 + local_1c4;
        }
      }
    }
    local_1a0 = local_278;
    local_148 = local_278;
    local_190 = local_230;
    local_168 = local_230;
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_output_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 4;
    const int h_tiles = outh / 4;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[4][6] = {
    //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
    //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
    //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
    //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
    // };

    // 0 = r00 + (r01 + r02) + (r03 + r04)
    // 1 =       (r01 - r02) + (r03 - r04) * 2
    // 2 =       (r01 + r02) + (r03 + r04) * 4
    // 3 = r05 + (r01 - r02) + (r03 - r04) * 8

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        float bias0 = biasptr ? biasptr[p] : 0.f;

        float tmp[4][6];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j);
                const float* output0_tm_1 = output0_tm_0 + tiles;
                const float* output0_tm_2 = output0_tm_0 + tiles * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 5;

                float* output0 = out0.row(i * 4) + (j * 4);

                for (int m = 0; m < 6; m++)
                {
                    float out0tm0 = output0_tm_0[0];
                    float out0tm1 = output0_tm_1[0];
                    float out0tm2 = output0_tm_2[0];
                    float out0tm3 = output0_tm_3[0];
                    float out0tm4 = output0_tm_4[0];
                    float out0tm5 = output0_tm_5[0];

                    float tmp02a = out0tm1 + out0tm2;
                    float tmp13a = out0tm1 - out0tm2;

                    float tmp02b = out0tm3 + out0tm4;
                    float tmp13b = out0tm3 - out0tm4;

                    float tmp0m = out0tm0 + tmp02a + tmp02b;
                    float tmp1m = tmp13a + tmp13b * 2;
                    float tmp2m = tmp02a + tmp02b * 4;
                    float tmp3m = out0tm5 + tmp13a + tmp13b * 8;

                    tmp[0][m] = tmp0m;
                    tmp[1][m] = tmp1m;
                    tmp[2][m] = tmp2m;
                    tmp[3][m] = tmp3m;

                    output0_tm_0 += tiles * 6;
                    output0_tm_1 += tiles * 6;
                    output0_tm_2 += tiles * 6;
                    output0_tm_3 += tiles * 6;
                    output0_tm_4 += tiles * 6;
                    output0_tm_5 += tiles * 6;
                }

                for (int m = 0; m < 4; m++)
                {
                    float tmp00 = tmp[m][0];
                    float tmp01 = tmp[m][1];
                    float tmp02 = tmp[m][2];
                    float tmp03 = tmp[m][3];
                    float tmp04 = tmp[m][4];
                    float tmp05 = tmp[m][5];

                    float tmp02a = tmp01 + tmp02;
                    float tmp13a = tmp01 - tmp02;

                    float tmp02b = tmp03 + tmp04;
                    float tmp13b = tmp03 - tmp04;

                    float out00 = bias0 + tmp00 + tmp02a + tmp02b;
                    float out01 = bias0 + tmp13a + tmp13b * 2;
                    float out02 = bias0 + tmp02a + tmp02b * 4;
                    float out03 = bias0 + tmp05 + tmp13a + tmp13b * 8;

                    output0[0] = out00;
                    output0[1] = out01;
                    output0[2] = out02;
                    output0[3] = out03;

                    output0 += outw;
                }
            }
        }
    }
}